

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.cpp
# Opt level: O0

void __thiscall setup::icon_entry::load(icon_entry *this,istream *is,info *i)

{
  unsigned_short uVar1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  enum_type eVar5;
  long lVar6;
  flag_type fVar7;
  int_adapter<unsigned_int> *in_RDX;
  stored_flag_reader<setup::icon_entry::flags_Enum_> *in_RSI;
  long in_RDI;
  stored_enum<setup::(anonymous_namespace)::stored_close_setting> *in_stack_00000048;
  stored_flag_reader<flags<setup::icon_entry::flags_Enum_,_8UL>_> flagreader;
  size_t guid_size;
  undefined4 in_stack_fffffffffffffe98;
  enum_type in_stack_fffffffffffffe9c;
  istream *in_stack_fffffffffffffea0;
  stored_flag_reader<setup::icon_entry::flags_Enum_> *psVar8;
  encoded_string local_c0;
  info *in_stack_ffffffffffffff60;
  istream *in_stack_ffffffffffffff68;
  item *in_stack_ffffffffffffff70;
  encoded_string local_78;
  encoded_string local_60;
  encoded_string local_48;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  stored_flag_reader<setup::icon_entry::flags_Enum_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x1030000) {
    util::load<unsigned_int>((istream *)0x1770fd);
  }
  util::encoded_string::encoded_string
            (&local_30,(string *)(in_RDI + 0x100),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffea0,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  util::encoded_string::encoded_string
            (&local_48,(string *)(in_RDI + 0x120),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffea0,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  util::encoded_string::encoded_string
            (&local_60,(string *)(in_RDI + 0x140),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffea0,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  util::encoded_string::encoded_string
            (&local_78,(string *)(in_RDI + 0x160),local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffea0,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  util::encoded_string::encoded_string
            ((encoded_string *)&stack0xffffffffffffff70,(string *)(in_RDI + 0x180),
             local_18[6].value_,(bitset<256UL> *)(local_18 + 0x138));
  util::operator>>(in_stack_fffffffffffffea0,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  util::encoded_string::encoded_string
            ((encoded_string *)&stack0xffffffffffffff58,(string *)(in_RDI + 0x1a0),
             local_18[6].value_);
  util::operator>>(in_stack_fffffffffffffea0,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  item::load_condition_data
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x5030500) {
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string(&local_c0,(string *)(in_RDI + 0x1c0),local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffea0,
                     (encoded_string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                    );
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x6010000) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::resize(in_RDI + 0x1e0);
    psVar8 = local_10;
    lVar6 = std::__cxx11::string::operator[](in_RDI + 0x1e0);
    std::istream::read((char *)psVar8,lVar6);
  }
  item::load_version_data
            ((item *)in_stack_fffffffffffffea0,
             (istream *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (version *)0x177409);
  setup::version::bits((version *)in_stack_fffffffffffffea0);
  iVar4 = util::load<int>(in_stack_fffffffffffffea0,
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  *(int *)(in_RDI + 0x200) = iVar4;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x1031800) {
    *(undefined4 *)(in_RDI + 0x204) = 1;
  }
  else {
    iVar4 = util::load<int>((istream *)0x177460);
    *(int *)(in_RDI + 0x204) = iVar4;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x1030f00) {
    *(undefined4 *)(in_RDI + 0x208) = 0;
  }
  else {
    stored_enum<setup::(anonymous_namespace)::stored_close_setting>::stored_enum
              ((stored_enum<setup::(anonymous_namespace)::stored_close_setting> *)
               in_stack_fffffffffffffea0,
               (istream *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    eVar5 = stored_enum<setup::(anonymous_namespace)::stored_close_setting>::get(in_stack_00000048);
    *(enum_type *)(in_RDI + 0x208) = eVar5;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x2000700) {
    *(undefined2 *)(in_RDI + 0x20c) = 0;
  }
  else {
    uVar1 = util::load<unsigned_short>((istream *)0x1774f3);
    *(unsigned_short *)(in_RDI + 0x20c) = uVar1;
  }
  setup::version::bits((version *)local_10);
  stored_flag_reader<flags<setup::icon_entry::flags_Enum_,_8UL>_>::stored_flag_reader
            ((stored_flag_reader<flags<setup::icon_entry::flags_Enum_,_8UL>_> *)local_10,
             (istream *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0x177540);
  stored_flag_reader<setup::icon_entry::flags_Enum_>::add(local_10,in_stack_fffffffffffffe9c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  psVar8 = local_10;
  if (uVar3 < 0x1031a00) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add(local_10,in_stack_fffffffffffffe9c);
    psVar8 = local_10;
  }
  stored_flag_reader<setup::icon_entry::flags_Enum_>::add(psVar8,in_stack_fffffffffffffe9c);
  uVar2 = setup::version::bits((version *)psVar8);
  if (uVar2 != 0x10) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add(psVar8,in_stack_fffffffffffffe9c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x50002ff < uVar3) {
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
    if (uVar3 < 0x6030000) {
      stored_flag_reader<setup::icon_entry::flags_Enum_>::add(psVar8,in_stack_fffffffffffffe9c);
    }
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x50401ff < uVar3) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add(psVar8,in_stack_fffffffffffffe9c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x504ffff < uVar3) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add(psVar8,in_stack_fffffffffffffe9c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x600ffff < uVar3) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add(psVar8,in_stack_fffffffffffffe9c);
  }
  fVar7 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  ((Type *)(in_RDI + 0x210))->super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)fVar7._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void icon_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(filename, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(parameters, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(working_dir, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(icon_file, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(comment, i.codepage);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(5, 3, 5)) {
		is >> util::encoded_string(app_user_model_id, i.codepage);
	} else {
		app_user_model_id.clear();
	}
	
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		const size_t guid_size = 16;
		app_user_model_toast_activator_clsid.resize(guid_size);
		is.read(&app_user_model_toast_activator_clsid[0], std::streamsize(guid_size));
	} else {
		app_user_model_toast_activator_clsid.clear();
	}
	
	load_version_data(is, i.version);
	
	icon_index = util::load<boost::int32_t>(is, i.version.bits());
	
	if(i.version >= INNO_VERSION(1, 3, 24)) {
		show_command = util::load<boost::int32_t>(is);
	} else {
		show_command = 1;
	}
	if(i.version >= INNO_VERSION(1, 3, 15)) {
		close_on_exit = stored_enum<stored_close_setting>(is).get();
	} else {
		close_on_exit = NoSetting;
	}
	
	if(i.version >= INNO_VERSION(2, 0, 7)) {
		hotkey = util::load<boost::uint16_t>(is);
	} else {
		hotkey = 0;
	}
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	flagreader.add(NeverUninstall);
	if(i.version < INNO_VERSION(1, 3, 26)) {
		flagreader.add(RunMinimized);
	}
	flagreader.add(CreateOnlyIfFileExists);
	if(i.version.bits() != 16) {
		flagreader.add(UseAppPaths);
	}
	if(i.version >= INNO_VERSION(5, 0, 3) && i.version < INNO_VERSION(6, 3, 0)) {
		flagreader.add(FolderShortcut);
	}
	if(i.version >= INNO_VERSION(5, 4, 2)) {
		flagreader.add(ExcludeFromShowInNewInstall);
	}
	if(i.version >= INNO_VERSION(5, 5, 0)) {
		flagreader.add(PreventPinning);
	}
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		flagreader.add(HasAppUserModelToastActivatorCLSID);
	}
	
	options = flagreader.finalize();
}